

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void remove_dot_segments(char *inout)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *out_end;
  size_t __n;
  
  pcVar3 = inout;
  if (inout == (char *)0x0) {
    return;
  }
  do {
    if (*pcVar3 == '\\') {
      *pcVar3 = '/';
    }
    else if (*pcVar3 == '\0') break;
    pcVar3 = pcVar3 + 1;
  } while( true );
  cVar1 = *inout;
  pcVar3 = inout;
  pcVar4 = inout;
  while (cVar1 != '\0') {
    iVar2 = strncmp(pcVar3,"../",3);
    if (iVar2 == 0) {
      pcVar3 = pcVar3 + 3;
    }
    else {
      iVar2 = strncmp(pcVar3,"./",2);
      if ((iVar2 == 0) || (iVar2 = strncmp(pcVar3,"/./",3), iVar2 == 0)) {
        pcVar3 = pcVar3 + 2;
      }
      else {
        iVar2 = strcmp(pcVar3,"/.");
        if (iVar2 == 0) {
          pcVar3[1] = '\0';
        }
        else {
          iVar2 = strncmp(pcVar3,"/../",4);
          if (iVar2 == 0) {
            pcVar3 = pcVar3 + 3;
            if (pcVar4 != inout) {
              pcVar5 = pcVar4 + -1;
              do {
                pcVar4 = inout;
                if (pcVar5 == inout) goto LAB_00119e76;
                pcVar4 = pcVar5 + -1;
                cVar1 = *pcVar5;
                pcVar5 = pcVar4;
              } while (cVar1 != '/');
LAB_00119eca:
              pcVar4 = pcVar4 + 1;
            }
          }
          else {
            iVar2 = strcmp(pcVar3,"/..");
            if (iVar2 == 0) {
              pcVar3[1] = '\0';
              if (pcVar4 != inout) {
                pcVar5 = pcVar4 + -1;
                do {
                  pcVar4 = inout;
                  if (pcVar5 == inout) goto LAB_00119e76;
                  pcVar4 = pcVar5 + -1;
                  cVar1 = *pcVar5;
                  pcVar5 = pcVar4;
                } while (cVar1 != '/');
                goto LAB_00119eca;
              }
            }
            else {
              iVar2 = strcmp(pcVar3,".");
              if ((iVar2 == 0) || (iVar2 = strcmp(pcVar3,".."), iVar2 == 0)) {
                *pcVar3 = '\0';
              }
              else {
                do {
                  *pcVar4 = *pcVar3;
                  pcVar4 = pcVar4 + 1;
                  pcVar5 = pcVar3 + 1;
                  pcVar3 = pcVar3 + 1;
                  if (*pcVar5 == '\0') break;
                } while (*pcVar5 != '/');
              }
            }
          }
        }
      }
    }
LAB_00119e76:
    cVar1 = *pcVar3;
  }
  *pcVar4 = '\0';
  pcVar4 = inout;
  pcVar3 = inout;
  do {
    while( true ) {
      while (cVar1 = *pcVar3, cVar1 != '.') {
        if (cVar1 == '\0') {
          *pcVar4 = '\0';
          return;
        }
        if (cVar1 == '/') {
          *pcVar4 = '/';
          do {
            pcVar5 = pcVar3 + 1;
            pcVar3 = pcVar3 + 1;
          } while (*pcVar5 == '/');
          pcVar4 = pcVar4 + 1;
        }
        else {
          *pcVar4 = cVar1;
          pcVar4 = pcVar4 + 1;
          pcVar3 = pcVar3 + 1;
        }
      }
      __n = 0;
      do {
        cVar1 = pcVar3[__n + 1];
        __n = __n + 1;
      } while (cVar1 == '.');
      if (cVar1 != '\0') break;
LAB_00119f09:
      pcVar3 = pcVar3 + __n;
    }
    if (cVar1 == '/') {
      if ((pcVar4 != inout) && (pcVar4[-1] == '/')) {
        pcVar4 = pcVar4 + -1;
      }
      goto LAB_00119f09;
    }
    memset(pcVar4,0x2e,__n);
    pcVar3 = pcVar3 + __n;
    pcVar4 = pcVar4 + __n;
  } while( true );
}

Assistant:

static void
remove_dot_segments(char *inout)
{
	/* Windows backend protection
	 * (https://tools.ietf.org/html/rfc3986#section-7.3): Replace backslash
	 * in URI by slash */
	char *out_end = inout;
	char *in = inout;

	if (!in) {
		/* Param error. */
		return;
	}

	while (*in) {
		if (*in == '\\') {
			*in = '/';
		}
		in++;
	}

	/* Algorithm "remove_dot_segments" from
	 * https://tools.ietf.org/html/rfc3986#section-5.2.4 */
	/* Step 1:
	 * The input buffer is initialized.
	 * The output buffer is initialized to the empty string.
	 */
	in = inout;

	/* Step 2:
	 * While the input buffer is not empty, loop as follows:
	 */
	/* Less than out_end of the inout buffer is used as output, so keep
	 * condition: out_end <= in */
	while (*in) {
		/* Step 2a:
		 * If the input buffer begins with a prefix of "../" or "./",
		 * then remove that prefix from the input buffer;
		 */
		if (!strncmp(in, "../", 3)) {
			in += 3;
		} else if (!strncmp(in, "./", 2)) {
			in += 2;
		}
		/* otherwise */
		/* Step 2b:
		 * if the input buffer begins with a prefix of "/./" or "/.",
		 * where "." is a complete path segment, then replace that
		 * prefix with "/" in the input buffer;
		 */
		else if (!strncmp(in, "/./", 3)) {
			in += 2;
		} else if (!strcmp(in, "/.")) {
			in[1] = 0;
		}
		/* otherwise */
		/* Step 2c:
		 * if the input buffer begins with a prefix of "/../" or "/..",
		 * where ".." is a complete path segment, then replace that
		 * prefix with "/" in the input buffer and remove the last
		 * segment and its preceding "/" (if any) from the output
		 * buffer;
		 */
		else if (!strncmp(in, "/../", 4)) {
			in += 3;
			if (inout != out_end) {
				/* remove last segment */
				do {
					out_end--;
				} while ((inout != out_end) && (*out_end != '/'));
			}
		} else if (!strcmp(in, "/..")) {
			in[1] = 0;
			if (inout != out_end) {
				/* remove last segment */
				do {
					out_end--;
				} while ((inout != out_end) && (*out_end != '/'));
			}
		}
		/* otherwise */
		/* Step 2d:
		 * if the input buffer consists only of "." or "..", then remove
		 * that from the input buffer;
		 */
		else if (!strcmp(in, ".") || !strcmp(in, "..")) {
			*in = 0;
		}
		/* otherwise */
		/* Step 2e:
		 * move the first path segment in the input buffer to the end of
		 * the output buffer, including the initial "/" character (if
		 * any) and any subsequent characters up to, but not including,
		 * the next "/" character or the end of the input buffer.
		 */
		else {
			do {
				*out_end = *in;
				out_end++;
				in++;
			} while ((*in != 0) && (*in != '/'));
		}
	}

	/* Step 3:
	 * Finally, the output buffer is returned as the result of
	 * remove_dot_segments.
	 */
	/* Terminate output */
	*out_end = 0;

	/* For Windows, the files/folders "x" and "x." (with a dot but without
	 * extension) are identical. Replace all "./" by "/" and remove a "." at
	 * the end. Also replace all "//" by "/". Repeat until there is no "./"
	 * or "//" anymore.
	 */
	out_end = in = inout;
	while (*in) {
		if (*in == '.') {
			/* remove . at the end or preceding of / */
			char *in_ahead = in;
			do {
				in_ahead++;
			} while (*in_ahead == '.');
			if (*in_ahead == '/') {
				in = in_ahead;
				if ((out_end != inout) && (out_end[-1] == '/')) {
					/* remove generated // */
					out_end--;
				}
			} else if (*in_ahead == 0) {
				in = in_ahead;
			} else {
				do {
					*out_end++ = '.';
					in++;
				} while (in != in_ahead);
			}
		} else if (*in == '/') {
			/* replace // by / */
			*out_end++ = '/';
			do {
				in++;
			} while (*in == '/');
		} else {
			*out_end++ = *in;
			in++;
		}
	}
	*out_end = 0;
}